

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_SetNativeIntElementI_Int32_NoConvert
               (Var instance,int32 aElementIndex,int32 iValue,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  BOOL converted;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  int32 iValue_local;
  int32 aElementIndex_local;
  Var instance_local;
  
  BVar3 = OP_SetNativeIntElementI_Int32(instance,aElementIndex,iValue,scriptContext,flags);
  if (BVar3 == 0) {
    return 0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                              ,0x130b,"(false)","Unexpected native array conversion");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeIntElementI_Int32_NoConvert(
        Var instance,
        int32 aElementIndex,
        int32 iValue,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeIntElementI_Int32_NoConvert);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetNativeIntElementI_Int32_NoConvert, Op_SetNativeIntElementI_Int32);
        BOOL converted = OP_SetNativeIntElementI_Int32(instance, aElementIndex, iValue, scriptContext, flags);
        if (converted)
        {
            AssertMsg(false, "Unexpected native array conversion");
            Js::Throw::FatalInternalError();
        }
        return FALSE;
        JIT_HELPER_END(Op_SetNativeIntElementI_Int32_NoConvert);
    }